

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_aegis128x2.cc
# Opt level: O2

int aead_aegis_128x2_seal_scatter
              (EVP_AEAD_CTX *ctx,uint8_t *out,uint8_t *out_tag,size_t *out_tag_len,
              size_t max_out_tag_len,uint8_t *nonce,size_t nonce_len,uint8_t *in,size_t in_len,
              uint8_t *extra_in,size_t extra_in_len,uint8_t *ad,size_t ad_len)

{
  byte bVar1;
  long lVar2;
  int reason;
  uint8_t *puVar3;
  int line;
  size_t __n;
  undefined1 *puVar4;
  ulong uVar5;
  ulong uVar6;
  size_t __n_00;
  long lVar7;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  uint8_t local_1c0 [64];
  longlong local_180 [42];
  
  bVar1 = ctx->tag_len;
  if (max_out_tag_len < bVar1) {
    reason = 0x67;
    line = 0x112;
LAB_0016e399:
    ERR_put_error(0x1e,0,reason,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_aegis128x2.cc"
                  ,line);
    return 0;
  }
  if (0x10 < nonce_len) {
    reason = 0x79;
    line = 0x116;
    goto LAB_0016e399;
  }
  aegis_128x2_state_init((ctx->state).opaque,nonce,nonce_len,(aes_block_t_conflict *)local_180);
  puVar3 = local_1c0;
  for (uVar5 = 0x40; uVar5 <= ad_len; uVar5 = uVar5 + 0x40) {
    aead_aegis_128x2_enc(puVar3,ad,(aes_block_t_conflict *)local_180);
    ad = ad + 0x40;
  }
  uVar5 = ad_len & 0x3f;
  if (uVar5 != 0) {
    memset(local_200 + uVar5,0,0x40 - uVar5);
    memcpy(local_200,ad,uVar5);
    aead_aegis_128x2_enc(local_1c0,local_200,(aes_block_t_conflict *)local_180);
  }
  puVar4 = local_200;
  uVar5 = 0;
  while (uVar5 + 0x40 <= in_len) {
    aead_aegis_128x2_enc(out + uVar5,in + uVar5,(aes_block_t_conflict *)local_180);
    puVar3 = puVar3 + -0x40;
    puVar4 = puVar4 + -0x40;
    uVar5 = uVar5 + 0x40;
  }
  local_200 = ZEXT1632(ZEXT816(0) << 0x40);
  __n_00 = in_len - uVar5;
  lVar7 = uVar5 - in_len;
  local_1e0 = local_200;
  if (extra_in_len == 0) {
    if (lVar7 == 0) goto LAB_0016e688;
    memcpy(local_200,in + uVar5,__n_00);
    aead_aegis_128x2_enc(local_1c0,local_200,(aes_block_t_conflict *)local_180);
    puVar3 = out + uVar5;
  }
  else {
    uVar6 = lVar7 + 0x40;
    __n = extra_in_len;
    if (uVar6 < extra_in_len) {
      __n = uVar6;
    }
    if (lVar7 != 0) {
      memcpy(local_200,in + uVar5,__n_00);
    }
    if (in_len - 0x40 != uVar5) {
      memcpy(puVar4 + in_len,extra_in,__n);
    }
    aead_aegis_128x2_enc(local_1c0,local_200,(aes_block_t_conflict *)local_180);
    if (lVar7 != 0) {
      memcpy(out + uVar5,local_1c0,__n_00);
    }
    if (in_len - 0x40 != uVar5) {
      memcpy(out_tag,puVar3 + in_len,__n);
    }
    uVar5 = uVar6;
    if (extra_in_len < uVar6) {
      uVar5 = extra_in_len;
    }
    for (lVar7 = 0; uVar5 + lVar7 + 0x40 < extra_in_len; lVar7 = lVar7 + 0x40) {
      aead_aegis_128x2_enc
                (out_tag + lVar7 + uVar5,extra_in + lVar7 + uVar5,(aes_block_t_conflict *)local_180)
      ;
    }
    lVar2 = 0;
    if (uVar6 <= extra_in_len) {
      lVar2 = extra_in_len - uVar6;
    }
    if (lVar2 == lVar7) goto LAB_0016e688;
    if (extra_in_len < uVar6) {
      uVar6 = extra_in_len;
    }
    __n_00 = (extra_in_len - uVar6) - lVar7;
    local_1e0 = ZEXT1632(ZEXT816(0));
    local_200 = ZEXT1632(ZEXT816(0));
    memcpy(local_200,extra_in + lVar7 + uVar6,__n_00);
    aead_aegis_128x2_enc(local_1c0,local_200,(aes_block_t_conflict *)local_180);
    puVar3 = out_tag + uVar6 + lVar7;
  }
  memcpy(puVar3,local_1c0,__n_00);
LAB_0016e688:
  aead_aegis_128x2_tag
            (out_tag + extra_in_len,ad_len,in_len + extra_in_len,(aes_block_t_conflict *)local_180);
  *out_tag_len = bVar1 + extra_in_len;
  return 1;
}

Assistant:

static int aead_aegis_128x2_seal_scatter(
    const EVP_AEAD_CTX *ctx, uint8_t *out, uint8_t *out_tag,
    size_t *out_tag_len, size_t max_out_tag_len, const uint8_t *nonce,
    size_t nonce_len, const uint8_t *in, size_t in_len, const uint8_t *extra_in,
    size_t extra_in_len, const uint8_t *ad, size_t ad_len) {
  const struct aead_aegis_128x2_ctx *aegis_ctx =
      (struct aead_aegis_128x2_ctx *)&ctx->state;

  return aegis_128x2_seal_scatter(
      aegis_ctx->key, out, out_tag, out_tag_len, max_out_tag_len, nonce,
      nonce_len, in, in_len, extra_in, extra_in_len, ad, ad_len, ctx->tag_len);
}